

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O3

void ptls_aead__do_encrypt_v
               (ptls_aead_context_t *ctx,void *_output,ptls_iovec_t *input,size_t incnt,uint64_t seq
               ,void *aad,size_t aadlen)

{
  size_t *psVar1;
  undefined1 auVar2 [16];
  
  (*ctx->do_encrypt_init)(ctx,seq,aad,aadlen);
  if (incnt != 0) {
    psVar1 = &input->len;
    do {
      auVar2 = (undefined1  [16])
               (*ctx->do_encrypt_update)(ctx,_output,((ptls_iovec_t *)(psVar1 + -1))->base,*psVar1);
      _output = (void *)(auVar2._0_8_ + (long)_output);
      psVar1 = psVar1 + 2;
      incnt = incnt - 1;
    } while (incnt != 0);
  }
  (*ctx->do_encrypt_final)(ctx,_output);
  return;
}

Assistant:

inline void ptls_aead__do_encrypt_v(ptls_aead_context_t *ctx, void *_output, ptls_iovec_t *input, size_t incnt, uint64_t seq,
                                    const void *aad, size_t aadlen)
{
    uint8_t *output = (uint8_t *)_output;

    ctx->do_encrypt_init(ctx, seq, aad, aadlen);
    for (size_t i = 0; i < incnt; ++i)
        output += ctx->do_encrypt_update(ctx, output, input[i].base, input[i].len);
    ctx->do_encrypt_final(ctx, output);
}